

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzer.cpp
# Opt level: O0

void __thiscall SimpleParallelAnalyzer::SimpleParallelAnalyzer(SimpleParallelAnalyzer *this)

{
  SimpleParallelAnalyzerSettings *this_00;
  SimpleParallelAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__SimpleParallelAnalyzer_0011ad50;
  this_00 = (SimpleParallelAnalyzerSettings *)operator_new(0x68);
  SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings(this_00);
  std::auto_ptr<SimpleParallelAnalyzerSettings>::auto_ptr(&this->mSettings,this_00);
  std::auto_ptr<SimpleParallelAnalyzerResults>::auto_ptr(&this->mResults,(element_type *)0x0);
  std::vector<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>::vector(&this->mData);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->mDataMasks);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector(&this->mDataNextEdge)
  ;
  std::vector<Channel,_std::allocator<Channel>_>::vector(&this->mDataChannels);
  SimpleParallelSimulationDataGenerator::SimpleParallelSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  std::auto_ptr<SimpleParallelAnalyzerSettings>::get(&this->mSettings);
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

SimpleParallelAnalyzer::SimpleParallelAnalyzer()
:	Analyzer2(),  
	mSettings( new SimpleParallelAnalyzerSettings() ),
	mSimulationInitilized( false )
{
	SetAnalyzerSettings( mSettings.get() );
}